

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

void __thiscall ON_HermiteSurface::Destroy(ON_HermiteSurface *this)

{
  long lVar1;
  int i;
  long lVar2;
  
  ON_SimpleArray<double>::Destroy(&this->m_u_parameters);
  ON_SimpleArray<double>::Destroy(&this->m_v_parameters);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < (this->m_grid_points).m_count; lVar2 = lVar2 + 1) {
    ON_SimpleArray<ON_3dPoint>::Destroy
              ((ON_SimpleArray<ON_3dPoint> *)
               ((long)&((this->m_grid_points).m_a)->_vptr_ON_SimpleArray + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::Destroy(&this->m_grid_points);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < (this->m_u_tangents).m_count; lVar2 = lVar2 + 1) {
    ON_SimpleArray<ON_3dVector>::Destroy
              ((ON_SimpleArray<ON_3dVector> *)
               ((long)&((this->m_u_tangents).m_a)->_vptr_ON_SimpleArray + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Destroy(&this->m_u_tangents);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < (this->m_v_tangents).m_count; lVar2 = lVar2 + 1) {
    ON_SimpleArray<ON_3dVector>::Destroy
              ((ON_SimpleArray<ON_3dVector> *)
               ((long)&((this->m_v_tangents).m_a)->_vptr_ON_SimpleArray + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Destroy(&this->m_v_tangents);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < (this->m_twists).m_count; lVar2 = lVar2 + 1) {
    ON_SimpleArray<ON_3dVector>::Destroy
              ((ON_SimpleArray<ON_3dVector> *)
               ((long)&((this->m_twists).m_a)->_vptr_ON_SimpleArray + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Destroy(&this->m_twists);
  return;
}

Assistant:

void ON_HermiteSurface::Destroy()
{
  m_u_parameters.Destroy();
  m_v_parameters.Destroy();

  for (int i = 0; i < m_grid_points.Count(); i++)
    m_grid_points[i].Destroy();
  m_grid_points.Destroy();

  for (int i = 0; i < m_u_tangents.Count(); i++)
    m_u_tangents[i].Destroy();
  m_u_tangents.Destroy();

  for (int i = 0; i < m_v_tangents.Count(); i++)
    m_v_tangents[i].Destroy();
  m_v_tangents.Destroy();

  for (int i = 0; i < m_twists.Count(); i++)
    m_twists[i].Destroy();
  m_twists.Destroy();
}